

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_dist_to_edge(REF_NODE ref_node,REF_INT *nodes,REF_DBL *xyz,REF_DBL *distance)

{
  double dVar1;
  REF_DBL *pRVar2;
  REF_STATUS RVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  REF_DBL RVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  pRVar2 = ref_node->real;
  lVar4 = (long)*nodes;
  lVar5 = (long)nodes[1];
  dVar6 = pRVar2[lVar4 * 0xf];
  dVar10 = pRVar2[lVar4 * 0xf + 1];
  dVar11 = pRVar2[lVar5 * 0xf] - dVar6;
  dVar12 = pRVar2[lVar5 * 0xf + 1] - dVar10;
  dVar1 = pRVar2[lVar4 * 0xf + 2];
  dVar8 = pRVar2[lVar5 * 0xf + 2] - dVar1;
  dVar9 = (xyz[2] - dVar1) * dVar8 + (*xyz - dVar6) * dVar11 + (xyz[1] - dVar10) * dVar12;
  dVar11 = dVar8 * dVar8 + dVar11 * dVar11 + dVar12 * dVar12;
  dVar8 = dVar11 * 1e+20;
  if (dVar8 <= -dVar8) {
    dVar8 = -dVar8;
  }
  dVar12 = dVar9;
  if (dVar9 <= -dVar9) {
    dVar12 = -dVar9;
  }
  if (dVar8 <= dVar12) {
    *distance = 0.0;
    printf("%s: %d: %s: div zero dis %.18e len %.18e\n",dVar9,
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xc32,
           "ref_node_dist_to_edge");
    RVar3 = 4;
  }
  else {
    dVar9 = dVar9 / dVar11;
    dVar8 = 1.0 - dVar9;
    dVar11 = *xyz - (pRVar2[lVar5 * 0xf] * dVar9 + dVar6 * dVar8);
    dVar10 = xyz[1] - (pRVar2[lVar5 * 0xf + 1] * dVar9 + dVar10 * dVar8);
    dVar6 = xyz[2] - (dVar9 * pRVar2[lVar5 * 0xf + 2] + dVar1 * dVar8);
    dVar6 = dVar6 * dVar6 + dVar11 * dVar11 + dVar10 * dVar10;
    if (dVar6 < 0.0) {
      RVar7 = sqrt(dVar6);
    }
    else {
      RVar7 = SQRT(dVar6);
    }
    *distance = RVar7;
    RVar3 = 0;
  }
  return RVar3;
}

Assistant:

REF_FCN REF_STATUS ref_node_dist_to_edge(REF_NODE ref_node, REF_INT *nodes,
                                         REF_DBL *xyz, REF_DBL *distance) {
  REF_DBL *a, *b;
  REF_DBL direction[3], diff[3], normal[3];
  REF_DBL len, dis, t;

  a = ref_node_xyz_ptr(ref_node, nodes[0]);
  b = ref_node_xyz_ptr(ref_node, nodes[1]);
  direction[0] = b[0] - a[0];
  direction[1] = b[1] - a[1];
  direction[2] = b[2] - a[2];
  diff[0] = xyz[0] - a[0];
  diff[1] = xyz[1] - a[1];
  diff[2] = xyz[2] - a[2];

  dis = ref_math_dot(direction, diff);
  len = ref_math_dot(direction, direction);

  if (ref_math_divisible(dis, len)) {
    t = dis / len;
  } else {
    *distance = 0.0;
    printf("%s: %d: %s: div zero dis %.18e len %.18e\n", __FILE__, __LINE__,
           __func__, dis, len);
    return REF_DIV_ZERO;
  }

  normal[0] = xyz[0] - (t * b[0] + (1.0 - t) * a[0]);
  normal[1] = xyz[1] - (t * b[1] + (1.0 - t) * a[1]);
  normal[2] = xyz[2] - (t * b[2] + (1.0 - t) * a[2]);

  *distance = sqrt(ref_math_dot(normal, normal));

  return REF_SUCCESS;
}